

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::second_tick(torrent *this,int tick_interval_ms)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  session_settings *psVar4;
  alert_manager *paVar5;
  vector<peer_connection_*> *this_00;
  reference pppVar6;
  long *plVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_111;
  anon_class_16_1_89917c4a local_108;
  duration<long,_std::ratio<1L,_1L>_> local_f8;
  duration local_f0;
  int local_e8;
  byte local_e2;
  undefined1 local_e1;
  int delay;
  bool is_inactive;
  __uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
  local_d0;
  peer_connection *local_c8;
  peer_connection *p;
  iterator __end2_1;
  iterator __begin2_1;
  vector<peer_connection_*> *__range2_1;
  undefined1 local_a0 [44];
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_74;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_70;
  int down_limit;
  int up_limit;
  duration<int,_std::ratio<1L,_1L>_> local_5c;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_58;
  __uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
  local_48;
  shared_ptr<libtorrent::torrent_plugin> *ext;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *__range2;
  shared_ptr<libtorrent::aux::torrent> self;
  int tick_interval_ms_local;
  torrent *this_local;
  
  self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = tick_interval_ms;
  ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
            ((enable_shared_from_this<libtorrent::aux::torrent> *)&__range2);
  __end2 = ::std::__cxx11::
           list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
           ::begin(&this->m_extensions);
  ext = (shared_ptr<libtorrent::torrent_plugin> *)
        ::std::__cxx11::
        list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
        ::end(&this->m_extensions);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&ext), bVar1) {
    local_48._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
    .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
         (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
         ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator*(&__end2);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                             .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>.
                             _M_head_impl);
    (*peVar3->_vptr_torrent_plugin[5])();
    ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator++(&__end2);
  }
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    local_111 = false;
    if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x18 & 1) != 0) &&
       (local_111 = false, (*(uint *)&this->field_0x600 & 1) != 0)) {
      local_5c.__r = (rep_conflict)upload_mode_time(this);
      psVar4 = settings(this);
      down_limit = session_settings::get_int(psVar4,0x4041);
      ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&up_limit,&down_limit);
      local_111 = ::std::chrono::operator>=
                            (&local_5c,(duration<long,_std::ratio<1L,_1L>_> *)&up_limit);
    }
    if (local_111 != false) {
      set_upload_mode(this,false);
    }
    bVar1 = is_paused(this);
    if ((bVar1) && ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1f & 1) == 0)) {
      iVar2 = stat::low_pass_upload_rate(&this->m_stat);
      if ((0 < iVar2) || (iVar2 = stat::low_pass_download_rate(&this->m_stat), 0 < iVar2)) {
        state_updated(this);
      }
      stat::second_tick(&this->m_stat,
                        self.
                        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_);
      update_want_tick(this);
      local_58.m_val = 1;
    }
    else {
      psVar4 = settings(this);
      bVar1 = session_settings::get_bool(psVar4,0x8010);
      if (bVar1) {
        local_70.m_val = upload_limit(this);
        local_74.m_val = download_limit(this);
        if ((0 < (int)local_74.m_val) &&
           (iVar2 = stat::download_ip_overhead(&this->m_stat), (int)local_74.m_val <= iVar2)) {
          paVar5 = alerts(this);
          bVar1 = alert_manager::should_post<libtorrent::performance_alert>(paVar5);
          if (bVar1) {
            paVar5 = alerts(this);
            get_handle((torrent *)(local_a0 + 0x18));
            local_a0._20_4_ = 3;
            alert_manager::
            emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                      (paVar5,(torrent_handle *)(local_a0 + 0x18),
                       (performance_warning_t *)(local_a0 + 0x14));
            torrent_handle::~torrent_handle((torrent_handle *)(local_a0 + 0x18));
          }
        }
        if ((0 < (int)local_70.m_val) &&
           (iVar2 = stat::upload_ip_overhead(&this->m_stat), (int)local_70.m_val <= iVar2)) {
          paVar5 = alerts(this);
          bVar1 = alert_manager::should_post<libtorrent::performance_alert>(paVar5);
          if (bVar1) {
            paVar5 = alerts(this);
            get_handle((torrent *)local_a0);
            __range2_1._4_4_ = 2;
            alert_manager::
            emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                      (paVar5,(torrent_handle *)local_a0,
                       (performance_warning_t *)((long)&__range2_1 + 4));
            torrent_handle::~torrent_handle((torrent_handle *)local_a0);
          }
        }
      }
      bVar1 = ::std::
              vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
              ::empty(&this->m_time_critical_pieces);
      if ((!bVar1) && (bVar1 = upload_mode(this), !bVar1)) {
        request_time_critical_pieces(this);
      }
      maybe_connect_web_seeds(this);
      this->m_swarm_last_seen_complete = this->m_last_seen_complete;
      this_00 = &(this->super_torrent_hot_members).m_connections;
      __end2_1 = ::std::
                 vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ::begin(&this_00->
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        );
      p = (peer_connection *)
          ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::end(&this_00->
                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               );
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                 *)&p), bVar1) {
        pppVar6 = __gnu_cxx::
                  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                  ::operator*(&__end2_1);
        local_c8 = *pppVar6;
        local_d0._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
        .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl =
             (tuple<libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
              )peer_connection::last_seen_complete(local_c8);
        plVar7 = ::std::max<long>((long *)&local_d0,&this->m_swarm_last_seen_complete);
        this->m_swarm_last_seen_complete = *plVar7;
        peer_connection::second_tick
                  (local_c8,self.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_);
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
        ::operator++(&__end2_1);
      }
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      bVar1 = alert_manager::should_post<libtorrent::stats_alert>
                        ((alert_manager *)CONCAT44(extraout_var,iVar2));
      if (bVar1) {
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)&delay);
        alert_manager::
        emplace_alert<libtorrent::stats_alert,libtorrent::torrent_handle,int_const&,libtorrent::aux::stat&>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)&delay,
                   (int *)((long)&self.
                                  super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 4),&this->m_stat);
        torrent_handle::~torrent_handle((torrent_handle *)&delay);
      }
      iVar2 = stat::last_payload_uploaded(&this->m_stat);
      this->m_total_uploaded = this->m_total_uploaded + (long)iVar2;
      iVar2 = stat::last_payload_downloaded(&this->m_stat);
      this->m_total_downloaded = this->m_total_downloaded + (long)iVar2;
      stat::second_tick(&this->m_stat,
                        self.
                        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_);
      local_e1 = 8;
      set_need_save_resume(this,(resume_data_flags_t)0x8);
      iVar2 = stat::low_pass_upload_rate(&this->m_stat);
      if ((0 < iVar2) || (iVar2 = stat::low_pass_download_rate(&this->m_stat), 0 < iVar2)) {
        state_updated(this);
      }
      local_e2 = is_inactive_internal(this);
      psVar4 = settings(this);
      bVar1 = session_settings::get_bool(psVar4,0x800d);
      if (bVar1) {
        if (((uint)(local_e2 & 1) == (*(uint *)&this->field_0x600 >> 6 & 1)) ||
           ((*(uint *)&this->field_0x5d8 >> 0x1a & 1) != 0)) {
          if (((uint)(local_e2 & 1) == (*(uint *)&this->field_0x600 >> 6 & 1)) &&
             ((*(uint *)&this->field_0x5d8 >> 0x1a & 1) != 0)) {
            boost::asio::
            basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::cancel(&this->m_inactivity_timer);
          }
        }
        else {
          psVar4 = settings(this);
          local_e8 = session_settings::get_int(psVar4,0x4038);
          ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_f8,&local_e8);
          ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1l>,void>
                    ((duration<long,std::ratio<1l,1000000000l>> *)&local_f0,&local_f8);
          boost::asio::
          basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::expires_after(&this->m_inactivity_timer,&local_f0);
          ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
                    (&local_108.self,(shared_ptr<libtorrent::aux::torrent> *)&__range2);
          boost::asio::
          basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
          ::async_wait<libtorrent::aux::torrent::second_tick(int)::__0>
                    ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                      *)&this->m_inactivity_timer,&local_108);
          second_tick(int)::$_0::~__0((__0 *)&local_108);
          *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xfbffffff | 0x4000000;
        }
      }
      update_want_tick(this);
      local_58.m_val = 0;
    }
  }
  else {
    local_58.m_val = 1;
  }
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)&__range2);
  return;
}

Assistant:

void torrent::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(want_tick());
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto self = shared_from_this();

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_extensions)
		{
			ext->tick();
		}

		if (m_abort) return;
#endif

		// if we're in upload only mode and we're auto-managed
		// leave upload mode every 10 minutes hoping that the error
		// condition has been fixed
		if (m_upload_mode && m_auto_managed && upload_mode_time() >=
			seconds(settings().get_int(settings_pack::optimistic_disk_retry)))
		{
			set_upload_mode(false);
		}

		if (is_paused() && !m_graceful_pause_mode)
		{
			// let the stats fade out to 0
			// check the rate before ticking the stats so that the last update is sent
			// with the rate equal to zero
			if (m_stat.low_pass_upload_rate() > 0 || m_stat.low_pass_download_rate() > 0)
				state_updated();
			m_stat.second_tick(tick_interval_ms);

			// the low pass transfer rate may just have dropped to 0
			update_want_tick();

			return;
		}

		if (settings().get_bool(settings_pack::rate_limit_ip_overhead))
		{
			int const up_limit = upload_limit();
			int const down_limit = download_limit();

			if (down_limit > 0
				&& m_stat.download_ip_overhead() >= down_limit
				&& alerts().should_post<performance_alert>())
			{
				alerts().emplace_alert<performance_alert>(get_handle()
					, performance_alert::download_limit_too_low);
			}

			if (up_limit > 0
				&& m_stat.upload_ip_overhead() >= up_limit
				&& alerts().should_post<performance_alert>())
			{
				alerts().emplace_alert<performance_alert>(get_handle()
					, performance_alert::upload_limit_too_low);
			}
		}

#ifndef TORRENT_DISABLE_STREAMING
		// ---- TIME CRITICAL PIECES ----

#if TORRENT_DEBUG_STREAMING > 0
		std::vector<partial_piece_info> queue;
		get_download_queue(&queue);

		std::vector<peer_info> peer_list;
		get_peer_info(peer_list);

		std::sort(queue.begin(), queue.end(), [](partial_piece_info const& lhs, partial_piece_info const& rhs)
			{ return lhs.piece_index < rhs.piece_index;; });

		std::printf("average piece download time: %.2f s (+/- %.2f s)\n"
			, m_average_piece_time / 1000.f
			, m_piece_time_deviation / 1000.f);
		for (auto& i : queue)
		{
			extern void print_piece(libtorrent::partial_piece_info* pp
				, std::vector<libtorrent::peer_info> const& peers
				, std::vector<time_critical_piece> const& time_critical);

			print_piece(&i, peer_list, m_time_critical_pieces);
		}
#endif // TORRENT_DEBUG_STREAMING

		if (!m_time_critical_pieces.empty() && !upload_mode())
		{
			request_time_critical_pieces();
		}
#endif // TORRENT_DISABLE_STREAMING

		// ---- WEB SEEDS ----

		maybe_connect_web_seeds();

		m_swarm_last_seen_complete = m_last_seen_complete;
		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);

			// look for the peer that saw a seed most recently
			m_swarm_last_seen_complete = std::max(p->last_seen_complete(), m_swarm_last_seen_complete);

			// updates the peer connection's ul/dl bandwidth
			// resource requests
			p->second_tick(tick_interval_ms);
		}
#if TORRENT_ABI_VERSION <= 2
		if (m_ses.alerts().should_post<stats_alert>())
			m_ses.alerts().emplace_alert<stats_alert>(get_handle(), tick_interval_ms, m_stat);
#endif

		m_total_uploaded += m_stat.last_payload_uploaded();
		m_total_downloaded += m_stat.last_payload_downloaded();
		m_stat.second_tick(tick_interval_ms);

		// these counters are saved in the resume data, since they updated
		// we need to save the resume data too
		set_need_save_resume(torrent_handle::if_counters_changed);

		// if the rate is 0, there's no update because of network transfers
		if (m_stat.low_pass_upload_rate() > 0 || m_stat.low_pass_download_rate() > 0)
			state_updated();

		// this section determines whether the torrent is active or not. When it
		// changes state, it may also trigger the auto-manage logic to reconsider
		// which torrents should be queued and started. There is a low pass
		// filter in order to avoid flapping (auto_manage_startup).
		bool is_inactive = is_inactive_internal();

		if (settings().get_bool(settings_pack::dont_count_slow_torrents))
		{
			if (is_inactive != m_inactive && !m_pending_active_change)
			{
				int const delay = settings().get_int(settings_pack::auto_manage_startup);
				m_inactivity_timer.expires_after(seconds(delay));
				m_inactivity_timer.async_wait([self](error_code const& ec) {
					self->wrap(&torrent::on_inactivity_tick, ec); });
				m_pending_active_change = true;
			}
			else if (is_inactive == m_inactive
				&& m_pending_active_change)
			{
				m_inactivity_timer.cancel();
			}
		}

		// want_tick depends on whether the low pass transfer rates are non-zero
		// or not. They may just have turned zero in this last tick.
		update_want_tick();
	}